

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

QNetworkCacheMetaData __thiscall
QNetworkReplyHttpImplPrivate::fetchCacheMetaData
          (QNetworkReplyHttpImplPrivate *this,QNetworkCacheMetaData *oldMetaData)

{
  QByteArrayView value_00;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QUtf8StringView other;
  QUtf8StringView other_00;
  anon_class_16_1_a8c68091_for__M_pred __pred;
  QUtf8StringView other_01;
  QByteArrayView header;
  QByteArrayView defaultValue;
  QByteArrayView defaultValue_00;
  QAnyStringView name_00;
  QAnyStringView newValue;
  QAnyStringView name_01;
  QByteArrayView header_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  Operation OVar4;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  qsizetype qVar6;
  const_pointer pvVar7;
  size_t in_RDX;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RSI;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  bool canDiskCache;
  bool checkExpired;
  qsizetype i;
  QNetworkReplyHttpImpl *q;
  QNetworkCacheMetaData *metaData;
  AttributesMap attributes;
  QByteArrayView value_3;
  QDateTime expiredDateTime;
  QByteArrayView value_2;
  QDateTime dt;
  QByteArray maxAge;
  QByteArrayView value;
  QHash<QByteArray,_QByteArray> cacheControl;
  QByteArrayView value_1;
  QLatin1StringView name;
  QHttpHeaders newHeaders;
  QHttpHeaders cacheHeaders;
  QByteArrayView headers [3];
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  undefined6 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc6;
  undefined1 in_stack_fffffffffffffcc7;
  QAnyStringView *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  WellKnownHeader in_stack_fffffffffffffcd4;
  QByteArrayView *in_stack_fffffffffffffcd8;
  QByteArrayView *in_stack_fffffffffffffce0;
  storage_type *psVar9;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar10;
  size_t in_stack_fffffffffffffd08;
  bool local_2d1;
  storage_type *local_2c0;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar11;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar12;
  QHash<QNetworkRequest::Attribute,_QVariant> local_270 [5];
  QByteArrayView in_stack_fffffffffffffdb8;
  QDateTime local_228 [8];
  QByteArrayView local_220;
  QByteArrayView local_210;
  qsizetype local_200;
  storage_type *local_1f8;
  qsizetype in_stack_fffffffffffffe10;
  storage_type *in_stack_fffffffffffffe18;
  qsizetype local_1d8;
  storage_type *local_1d0;
  QDateTime local_1c8 [8];
  undefined8 local_1c0 [4];
  bool local_1a0 [24];
  qsizetype local_188;
  storage_type *local_180;
  QByteArrayView local_170;
  QByteArrayView local_160;
  QHash<QByteArray,_QByteArray> local_150;
  QAnyStringView local_148;
  qsizetype local_138;
  char *local_130;
  qsizetype local_f8;
  char *local_f0;
  QByteArrayView local_a8;
  QLatin1StringView local_98;
  undefined8 local_88;
  undefined8 local_80;
  QVariant local_78;
  QVariant local_58;
  QByteArrayView local_38 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  aVar10 = in_RDI;
  aVar11 = in_RSI;
  aVar12 = in_RDI;
  aVar5.m_data = q_func(in_RSI.m_data);
  *(undefined8 *)aVar10.m_data = 0xaaaaaaaaaaaaaaaa;
  QNetworkCacheMetaData::QNetworkCacheMetaData
            ((QNetworkCacheMetaData *)
             CONCAT17(in_stack_fffffffffffffcc7,
                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
             (QNetworkCacheMetaData *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8))
  ;
  local_80 = 0xaaaaaaaaaaaaaaaa;
  QNetworkCacheMetaData::headers((QNetworkCacheMetaData *)in_stack_fffffffffffffcc8);
  local_88 = 0xaaaaaaaaaaaaaaaa;
  QNetworkReply::headers((QNetworkReply *)in_stack_fffffffffffffcc8);
  local_2c0 = (storage_type *)0x0;
  do {
    psVar9 = local_2c0;
    qVar6 = QHttpHeaders::size((QHttpHeaders *)
                               CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
    if (qVar6 <= (long)psVar9) {
      QNetworkCacheMetaData::setHeaders
                ((QNetworkCacheMetaData *)
                 CONCAT17(in_stack_fffffffffffffcc7,
                          CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
                 (QHttpHeaders *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
      local_2d1 = true;
      local_150.d = (Data *)0xaaaaaaaaaaaaaaaa;
      QHash<QByteArray,_QByteArray>::QHash(&local_150);
      local_160.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
      local_160.m_size = 0xaaaaaaaaaaaaaaaa;
      QByteArrayView::QByteArrayView(&local_170);
      QVar8.m_data = (storage_type *)in_RSI.m_data;
      QVar8.m_size = (qsizetype)in_RDI.m_data;
      local_160 = QHttpHeaders::value((QHttpHeaders *)in_stack_fffffffffffffcd8,
                                      in_stack_fffffffffffffcd4,QVar8);
      bVar1 = QByteArrayView::empty((QByteArrayView *)0x31cb7a);
      if (!bVar1) {
        local_188 = local_160.m_size;
        local_180 = local_160.m_data;
        header_00.m_data = in_stack_fffffffffffffe18;
        header_00.m_size = in_stack_fffffffffffffe10;
        parseHttpOptionHeader(header_00);
        QHash<QByteArray,_QByteArray>::operator=
                  ((QHash<QByteArray,_QByteArray> *)
                   CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffffcc8);
        QHash<QByteArray,_QByteArray>::~QHash
                  ((QHash<QByteArray,_QByteArray> *)
                   CONCAT17(in_stack_fffffffffffffcc7,
                            CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
        local_1a0[0] = true;
        local_1a0[1] = true;
        local_1a0[2] = true;
        local_1a0[3] = true;
        local_1a0[4] = true;
        local_1a0[5] = true;
        local_1a0[6] = true;
        local_1a0[7] = true;
        local_1a0[8] = true;
        local_1a0[9] = true;
        local_1a0[10] = true;
        local_1a0[0xb] = true;
        local_1a0[0xc] = true;
        local_1a0[0xd] = true;
        local_1a0[0xe] = true;
        local_1a0[0xf] = true;
        local_1a0[0x10] = true;
        local_1a0[0x11] = true;
        local_1a0[0x12] = true;
        local_1a0[0x13] = true;
        local_1a0[0x14] = true;
        local_1a0[0x15] = true;
        local_1a0[0x16] = true;
        local_1a0[0x17] = true;
        Qt::Literals::StringLiterals::operator____ba
                  ((char *)in_stack_fffffffffffffcd8,
                   CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
        QHash<QByteArray,_QByteArray>::value
                  ((QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffffcd8,
                   (QByteArray *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
        QByteArray::~QByteArray((QByteArray *)0x31cc51);
        bVar1 = QByteArray::isEmpty((QByteArray *)0x31cc5e);
        if (!bVar1) {
          local_1c0[0] = 0xaaaaaaaaaaaaaaaa;
          QDateTime::currentDateTimeUtc();
          QByteArray::toInt(local_1a0,0);
          QDateTime::addSecs((longlong)local_1c8);
          QDateTime::operator=
                    ((QDateTime *)
                     CONCAT17(in_stack_fffffffffffffcc7,
                              CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
                     (QDateTime *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
          QDateTime::~QDateTime(local_1c8);
          QNetworkCacheMetaData::setExpirationDate
                    ((QNetworkCacheMetaData *)
                     CONCAT17(in_stack_fffffffffffffcc7,
                              CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
                     (QDateTime *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
          QDateTime::~QDateTime((QDateTime *)local_1c0);
        }
        local_2d1 = bVar1;
        QByteArray::~QByteArray((QByteArray *)0x31cd03);
      }
      if (local_2d1) {
        QByteArrayView::QByteArrayView((QByteArrayView *)&stack0xfffffffffffffe18);
        defaultValue.m_data = (storage_type *)in_RSI.m_data;
        defaultValue.m_size = (qsizetype)in_RDI.m_data;
        QVar8 = QHttpHeaders::value((QHttpHeaders *)in_stack_fffffffffffffcd8,
                                    in_stack_fffffffffffffcd4,defaultValue);
        bVar1 = QByteArrayView::isEmpty((QByteArrayView *)0x31cd78);
        if (!bVar1) {
          local_1d8 = QVar8.m_size;
          local_200 = local_1d8;
          local_1d0 = QVar8.m_data;
          local_1f8 = local_1d0;
          QNetworkHeadersPrivate::fromHttpDate(in_stack_fffffffffffffdb8);
          QNetworkCacheMetaData::setExpirationDate
                    ((QNetworkCacheMetaData *)
                     CONCAT17(in_stack_fffffffffffffcc7,
                              CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
                     (QDateTime *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
          QDateTime::~QDateTime((QDateTime *)&stack0xfffffffffffffe10);
        }
      }
      local_210.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
      local_210.m_size = 0xaaaaaaaaaaaaaaaa;
      QByteArrayView::QByteArrayView(&local_220);
      defaultValue_00.m_data = (storage_type *)in_RSI.m_data;
      defaultValue_00.m_size = (qsizetype)in_RDI.m_data;
      local_210 = QHttpHeaders::value((QHttpHeaders *)in_stack_fffffffffffffcd8,
                                      in_stack_fffffffffffffcd4,defaultValue_00);
      bVar1 = QByteArrayView::isEmpty((QByteArrayView *)0x31ce53);
      if (!bVar1) {
        QNetworkHeadersPrivate::fromHttpDate(in_stack_fffffffffffffdb8);
        QNetworkCacheMetaData::setLastModified
                  ((QNetworkCacheMetaData *)
                   CONCAT17(in_stack_fffffffffffffcc7,
                            CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
                   (QDateTime *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
        QDateTime::~QDateTime(local_228);
      }
      OVar4 = QHttpNetworkRequest::operation((QHttpNetworkRequest *)0x31cec9);
      if (OVar4 == Get) {
        Qt::Literals::StringLiterals::operator____ba
                  ((char *)in_stack_fffffffffffffcd8,
                   CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
        in_stack_fffffffffffffcc7 =
             QHash<QByteArray,_QByteArray>::contains
                       ((QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffffcc8,
                        (QByteArray *)
                        CONCAT17(in_stack_fffffffffffffcc7,
                                 CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
        QByteArray::~QByteArray((QByteArray *)0x31cf12);
      }
      else {
        OVar4 = QHttpNetworkRequest::operation((QHttpNetworkRequest *)0x31cf34);
        if (OVar4 == Post) {
          Qt::Literals::StringLiterals::operator____ba
                    ((char *)in_stack_fffffffffffffcd8,
                     CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          in_stack_fffffffffffffcc6 =
               QHash<QByteArray,_QByteArray>::contains
                         ((QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffffcc8,
                          (QByteArray *)
                          CONCAT17(in_stack_fffffffffffffcc7,
                                   CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
          QByteArray::~QByteArray((QByteArray *)0x31cf7d);
        }
      }
      QNetworkCacheMetaData::setSaveToDisk
                ((QNetworkCacheMetaData *)
                 CONCAT17(in_stack_fffffffffffffcc7,
                          CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
                 (bool)in_stack_fffffffffffffcbf);
      local_270[0].d = (Data *)0xaaaaaaaaaaaaaaaa;
      QHash<QNetworkRequest::Attribute,_QVariant>::QHash(local_270);
      if (*(int *)((long)in_RSI.m_data + 600) == 0x130) {
        QNetworkCacheMetaData::attributes((QNetworkCacheMetaData *)in_stack_fffffffffffffcc8);
        QHash<QNetworkRequest::Attribute,_QVariant>::operator=
                  ((QHash<QNetworkRequest::Attribute,_QVariant> *)
                   CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (QHash<QNetworkRequest::Attribute,_QVariant> *)in_stack_fffffffffffffcc8);
        QHash<QNetworkRequest::Attribute,_QVariant>::~QHash
                  ((QHash<QNetworkRequest::Attribute,_QVariant> *)
                   CONCAT17(in_stack_fffffffffffffcc7,
                            CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
      }
      else {
        QVariant::QVariant(&local_58,*(int *)((long)in_RSI.m_data + 600));
        QHash<QNetworkRequest::Attribute,_QVariant>::insert
                  ((QHash<QNetworkRequest::Attribute,_QVariant> *)
                   CONCAT17(in_stack_fffffffffffffcc7,
                            CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
                   (Attribute *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                   (QVariant *)0x31d019);
        QVariant::~QVariant(&local_58);
        QVariant::QVariant(&local_78,(QString *)((long)in_RSI.m_data + 0x260));
        QHash<QNetworkRequest::Attribute,_QVariant>::insert
                  ((QHash<QNetworkRequest::Attribute,_QVariant> *)
                   CONCAT17(in_stack_fffffffffffffcc7,
                            CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
                   (Attribute *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                   (QVariant *)0x31d071);
        QVariant::~QVariant(&local_78);
      }
      QNetworkCacheMetaData::setAttributes
                ((QNetworkCacheMetaData *)
                 CONCAT17(in_stack_fffffffffffffcc7,
                          CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
                 (AttributesMap *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
      QHash<QNetworkRequest::Attribute,_QVariant>::~QHash
                ((QHash<QNetworkRequest::Attribute,_QVariant> *)
                 CONCAT17(in_stack_fffffffffffffcc7,
                          CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
      QHash<QByteArray,_QByteArray>::~QHash
                ((QHash<QByteArray,_QByteArray> *)
                 CONCAT17(in_stack_fffffffffffffcc7,
                          CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
      QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x31d102);
      QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x31d10f);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (QNetworkCacheMetaData)in_RDI.m_data;
      }
      __stack_chk_fail();
    }
    local_98.m_data = (char *)0xaaaaaaaaaaaaaaaa;
    local_98.m_size = 0xaaaaaaaaaaaaaaaa;
    local_98 = QHttpHeaders::nameAt
                         ((QHttpHeaders *)in_stack_fffffffffffffce0,
                          (qsizetype)in_stack_fffffffffffffcd8);
    local_a8.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
    local_a8.m_size = -0x5555555555555556;
    local_a8 = QHttpHeaders::valueAt
                         ((QHttpHeaders *)
                          CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                          (qsizetype)in_stack_fffffffffffffcc8);
    QByteArrayView::QByteArrayView<QLatin1String,_true>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (QLatin1String *)in_stack_fffffffffffffcc8);
    header.m_data = (storage_type *)in_RSI.m_data;
    header.m_size = (qsizetype)in_RDI.m_data;
    bVar1 = isHopByHop(header);
    if (!bVar1) {
      QBasicUtf8StringView<false>::QBasicUtf8StringView<char[11],_true>
                ((QBasicUtf8StringView<false> *)
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 (char (*) [11])in_stack_fffffffffffffcc8);
      other.m_size = (qsizetype)psVar9;
      other.m_data = (storage_type *)in_stack_fffffffffffffce0;
      iVar3 = QLatin1String::compare
                        ((QLatin1String *)
                         CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),other,
                         CaseInsensitive);
      if (iVar3 != 0) {
        QBasicUtf8StringView<false>::QBasicUtf8StringView<char[8],_true>
                  ((QBasicUtf8StringView<false> *)
                   CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (char (*) [8])in_stack_fffffffffffffcc8);
        other_00.m_size = (qsizetype)psVar9;
        other_00.m_data = (storage_type *)in_stack_fffffffffffffce0;
        iVar3 = QLatin1String::compare
                          ((QLatin1String *)
                           CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),other_00,
                           CaseInsensitive);
        if (((iVar3 == 0) && (qVar6 = QByteArrayView::size(&local_a8), qVar6 == 3)) &&
           (cVar2 = QByteArrayView::operator[](&local_a8,0), cVar2 == '1')) {
          cVar2 = QByteArrayView::operator[](&local_a8,1);
          bVar1 = QtMiscUtils::isAsciiDigit((int)cVar2);
          if (bVar1) {
            cVar2 = QByteArrayView::operator[](&local_a8,2);
            bVar1 = QtMiscUtils::isAsciiDigit((int)cVar2);
            if (bVar1) goto LAB_0031cac4;
          }
        }
        local_f8 = local_98.m_size;
        local_f0 = local_98.m_data;
        str.m_size._4_4_ = in_stack_fffffffffffffcd4;
        str.m_size._0_4_ = in_stack_fffffffffffffcd0;
        str.m_data = (char *)in_stack_fffffffffffffcd8;
        QAnyStringView::QAnyStringView(in_stack_fffffffffffffcc8,str);
        name_00.m_size = in_stack_fffffffffffffd08;
        name_00.field_0.m_data = aVar10.m_data;
        bVar1 = QHttpHeaders::contains((QHttpHeaders *)in_stack_fffffffffffffce0,name_00);
        if (bVar1) {
          memcpy(local_38,&DAT_0049ed00,0x30);
          in_stack_fffffffffffffcd8 = std::begin<QByteArrayView_const,3ul>(&local_38);
          in_stack_fffffffffffffce0 = std::end<QByteArrayView_const,3ul>(&local_38);
          QByteArrayView::QByteArrayView<QLatin1String,_true>
                    ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)
                     ,(QLatin1String *)in_stack_fffffffffffffcc8);
          value_00.m_size._6_1_ = in_stack_fffffffffffffcc6;
          value_00.m_size._0_6_ = in_stack_fffffffffffffcc0;
          value_00.m_size._7_1_ = in_stack_fffffffffffffcc7;
          value_00.m_data = (storage_type *)in_stack_fffffffffffffcc8;
          caseInsensitiveCompare(value_00);
          __pred.value.m_data = psVar9;
          __pred.value.m_size = (qsizetype)in_stack_fffffffffffffce0;
          bVar1 = std::any_of<QByteArrayView_const*,caseInsensitiveCompare(QByteArrayView)::__0>
                            ((QByteArrayView *)in_stack_fffffffffffffcc8,
                             (QByteArrayView *)
                             CONCAT17(in_stack_fffffffffffffcc7,
                                      CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0))
                             ,__pred);
          if (bVar1) goto LAB_0031cac4;
        }
        if (*(int *)((long)in_RSI.m_data + 600) == 0x130) {
          QBasicUtf8StringView<false>::QBasicUtf8StringView<char[15],_true>
                    ((QBasicUtf8StringView<false> *)
                     CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     (char (*) [15])in_stack_fffffffffffffcc8);
          other_01.m_size = (qsizetype)psVar9;
          other_01.m_data = (storage_type *)in_stack_fffffffffffffce0;
          iVar3 = QLatin1String::compare
                            ((QLatin1String *)
                             CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),other_01,
                             CaseInsensitive);
          if (iVar3 == 0) goto LAB_0031cac4;
        }
        local_138 = local_98.m_size;
        local_130 = local_98.m_data;
        str_00.m_size._4_4_ = in_stack_fffffffffffffcd4;
        str_00.m_size._0_4_ = in_stack_fffffffffffffcd0;
        str_00.m_data = (char *)in_stack_fffffffffffffcd8;
        QAnyStringView::QAnyStringView(in_stack_fffffffffffffcc8,str_00);
        in_stack_fffffffffffffcc8 = &local_148;
        pvVar7 = std::data<QByteArrayView>((QByteArrayView *)0x31ca73);
        in_stack_fffffffffffffcd0 = SUB84(pvVar7,0);
        in_stack_fffffffffffffcd4 = (WellKnownHeader)((ulong)pvVar7 >> 0x20);
        QtPrivate::lengthHelperContainer<QByteArrayView>((QByteArrayView *)0x31ca85);
        QAnyStringView::QAnyStringView<char,_true>
                  ((QAnyStringView *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (char *)in_stack_fffffffffffffcc8,
                   CONCAT17(in_stack_fffffffffffffcc7,
                            CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
        name_01.m_size = (size_t)aVar12.m_data;
        name_01.field_0.m_data = aVar11.m_data;
        newValue.m_size = in_RDX;
        newValue.field_0.m_data = aVar5.m_data;
        QHttpHeaders::replaceOrAppend((QHttpHeaders *)in_stack_fffffffffffffcc8,name_01,newValue);
      }
    }
LAB_0031cac4:
    local_2c0 = local_2c0 + 1;
  } while( true );
}

Assistant:

QNetworkCacheMetaData QNetworkReplyHttpImplPrivate::fetchCacheMetaData(const QNetworkCacheMetaData &oldMetaData) const
{
    Q_Q(const QNetworkReplyHttpImpl);

    QNetworkCacheMetaData metaData = oldMetaData;
    QHttpHeaders cacheHeaders = metaData.headers();

    const auto newHeaders = q->headers();
    for (qsizetype i = 0; i < newHeaders.size(); ++i) {
        const auto name = newHeaders.nameAt(i);
        const auto value = newHeaders.valueAt(i);

        if (isHopByHop(name))
            continue;

        if (name.compare("set-cookie", Qt::CaseInsensitive) == 0)
            continue;

        // for 4.6.0, we were planning to not store the date header in the
        // cached resource; through that we planned to reduce the number
        // of writes to disk when using a QNetworkDiskCache (i.e. don't
        // write to disk when only the date changes).
        // However, without the date we cannot calculate the age of the page
        // anymore.
        //if (header == "date")
            //continue;

        // Don't store Warning 1xx headers
        if (name.compare("warning", Qt::CaseInsensitive) == 0) {
            if (value.size() == 3
                && value[0] == '1'
                && isAsciiDigit(value[1])
                && isAsciiDigit(value[2]))
                continue;
        }

        if (cacheHeaders.contains(name)) {
            // Match the behavior of Firefox and assume Cache-Control: "no-transform"
            constexpr QByteArrayView headers[]=
                    {"content-encoding", "content-range", "content-type"};
            if (std::any_of(std::begin(headers), std::end(headers), caseInsensitiveCompare(name)))
                continue;
        }

        // IIS has been known to send "Content-Length: 0" on 304 responses, so
        // ignore this too
        if (statusCode == 304 && name.compare("content-length", Qt::CaseInsensitive) == 0)
            continue;

#if defined(QNETWORKACCESSHTTPBACKEND_DEBUG)
        QByteArrayView n = newHeaders.value(name);
        QByteArrayView o = cacheHeaders.value(name);
        if (n != o && name.compare("date", Qt::CaseInsensitive) != 0) {
            qDebug() << "replacing" << name;
            qDebug() << "new" << n;
            qDebug() << "old" << o;
        }
#endif
        cacheHeaders.replaceOrAppend(name, value);
    }
    metaData.setHeaders(cacheHeaders);

    bool checkExpired = true;

    QHash<QByteArray, QByteArray> cacheControl;
    auto value = cacheHeaders.value(QHttpHeaders::WellKnownHeader::CacheControl);
    if (!value.empty()) {
        cacheControl = parseHttpOptionHeader(value);
        QByteArray maxAge = cacheControl.value("max-age"_ba);
        if (!maxAge.isEmpty()) {
            checkExpired = false;
            QDateTime dt = QDateTime::currentDateTimeUtc();
            dt = dt.addSecs(maxAge.toInt());
            metaData.setExpirationDate(dt);
        }
    }
    if (checkExpired) {
        if (const auto value = cacheHeaders.value(
                    QHttpHeaders::WellKnownHeader::Expires); !value.isEmpty()) {
            QDateTime expiredDateTime = QNetworkHeadersPrivate::fromHttpDate(value);
            metaData.setExpirationDate(expiredDateTime);
        }
    }

    if (const auto value = cacheHeaders.value(
                QHttpHeaders::WellKnownHeader::LastModified); !value.isEmpty()) {
        metaData.setLastModified(QNetworkHeadersPrivate::fromHttpDate(value));
    }


    bool canDiskCache;
    // only cache GET replies by default, all other replies (POST, PUT, DELETE)
    //  are not cacheable by default (according to RFC 2616 section 9)
    if (httpRequest.operation() == QHttpNetworkRequest::Get) {

        canDiskCache = true;
        // HTTP/1.1. Check the Cache-Control header
        if (cacheControl.contains("no-store"_ba))
            canDiskCache = false;

    // responses to POST might be cacheable
    } else if (httpRequest.operation() == QHttpNetworkRequest::Post) {

        canDiskCache = false;
        // some pages contain "expires:" and "cache-control: no-cache" field,
        // so we only might cache POST requests if we get "cache-control: max-age ..."
        if (cacheControl.contains("max-age"_ba))
            canDiskCache = true;

    // responses to PUT and DELETE are not cacheable
    } else {
        canDiskCache = false;
    }

    metaData.setSaveToDisk(canDiskCache);
    QNetworkCacheMetaData::AttributesMap attributes;
    if (statusCode != 304) {
        // update the status code
        attributes.insert(QNetworkRequest::HttpStatusCodeAttribute, statusCode);
        attributes.insert(QNetworkRequest::HttpReasonPhraseAttribute, reasonPhrase);
    } else {
        // this is a redirection, keep the attributes intact
        attributes = oldMetaData.attributes();
    }
    metaData.setAttributes(attributes);
    return metaData;
}